

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> * __thiscall
vkt::shaderexecutor::TemplateFuncCaseFactory<vkt::shaderexecutor::Functions::Refract>::createCase
          (MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> *__return_storage_ptr__,
          TemplateFuncCaseFactory<vkt::shaderexecutor::Functions::Refract> *this,CaseContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *name;
  TestNode *this_00;
  Refract<1> *func;
  PrecisionCase *pPVar2;
  Refract<2> *func_00;
  Refract<3> *func_01;
  Refract<4> *func_02;
  string local_40;
  
  this_00 = (TestNode *)operator_new(0x70);
  name = (ctx->name)._M_dataplus._M_p;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,ctx->testContext,name,name);
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"scalar","");
  func = instance<vkt::shaderexecutor::Functions::Refract<1>>();
  pPVar2 = createFuncCase<vkt::shaderexecutor::Signature<float,float,float,float,vkt::shaderexecutor::Void>>
                     (ctx,&local_40,
                      (Func<vkt::shaderexecutor::Signature<float,_float,_float,_float,_vkt::shaderexecutor::Void>_>
                       *)func);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vec2","");
  func_00 = instance<vkt::shaderexecutor::Functions::Refract<2>>();
  pPVar2 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,float,vkt::shaderexecutor::Void>>
                     (ctx,&local_40,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_vkt::shaderexecutor::Void>_>
                       *)func_00);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vec3","");
  func_01 = instance<vkt::shaderexecutor::Functions::Refract<3>>();
  pPVar2 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,3>,tcu::Vector<float,3>,tcu::Vector<float,3>,float,vkt::shaderexecutor::Void>>
                     (ctx,&local_40,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
                       *)func_01);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vec4","");
  func_02 = instance<vkt::shaderexecutor::Functions::Refract<4>>();
  pPVar2 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,float,vkt::shaderexecutor::Void>>
                     (ctx,&local_40,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>_>
                       *)func_02);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->super_UniqueBase<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>).
  m_data.ptr = this_00;
  return __return_storage_ptr__;
}

Assistant:

MovePtr<TestNode>	createCase		(const CaseContext& ctx) const
	{
		TestCaseGroup*	group = new TestCaseGroup(ctx.testContext, ctx.name.c_str(), ctx.name.c_str());

		group->addChild(createFuncCase(ctx, "scalar", instance<GenF<1> >()));
		group->addChild(createFuncCase(ctx, "vec2", instance<GenF<2> >()));
		group->addChild(createFuncCase(ctx, "vec3", instance<GenF<3> >()));
		group->addChild(createFuncCase(ctx, "vec4", instance<GenF<4> >()));

		return MovePtr<TestNode>(group);
	}